

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::merge_nodes(btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
              *this,node_type *left,node_type *right)

{
  ulong i;
  node_type nVar1;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *c;
  StringLike **args;
  ulong uVar2;
  char *__function;
  allocator_type *extraout_RDX;
  allocator_type *extraout_RDX_00;
  allocator_type *extraout_RDX_01;
  allocator_type *paVar3;
  allocator_type *alloc;
  allocator_type *in_R9;
  size_type i_00;
  
  if ((((ulong)left & 7) == 0) && (((ulong)right & 7) == 0)) {
    uVar2 = *(ulong *)left;
    if (uVar2 != *(ulong *)right) {
      __assert_fail("parent() == src->parent()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x923,
                    "void phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>]"
                   );
    }
    if ((byte)left[8] + 1 != (uint)(byte)right[8]) {
      __assert_fail("position() + 1 == src->position()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x924,
                    "void phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>>::merge(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>]"
                   );
    }
    if ((uVar2 & 7) == 0) {
      args = (StringLike **)((ulong)(byte)left[8] * 0x20);
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
      ::value_init<phmap::priv::(anonymous_namespace)::StringLike*>
                ((btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,256,false>>
                  *)left,(ulong)(byte)left[10],(allocator_type *)((long)args + uVar2 + 0x10),args);
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
      ::uninitialized_move_n(right,(ulong)(byte)right[10],0,(ulong)(byte)left[10] + 1,left,in_R9);
      nVar1 = right[10];
      paVar3 = extraout_RDX;
      if ((ulong)(byte)nVar1 != 0) {
        i_00 = 0;
        do {
          btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
          ::value_destroy(right,i_00,paVar3);
          i_00 = i_00 + 1;
          paVar3 = extraout_RDX_00;
        } while ((byte)nVar1 != i_00);
      }
      if (left[0xb] == (node_type)0x0) {
        uVar2 = 0xffffffffffffffff;
        do {
          i = uVar2 + 1;
          nVar1 = left[10];
          c = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
              ::child(right,i);
          btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
          ::init_child(left,(int)uVar2 + (uint)(byte)nVar1 + 2,c);
          btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
          ::mutable_child(right,i);
          nVar1 = right[10];
          uVar2 = i;
          paVar3 = extraout_RDX_01;
        } while (i < (byte)nVar1);
      }
      else {
        nVar1 = right[10];
      }
      left[10] = (node_type)((char)nVar1 + (char)left[10] + '\x01');
      right[10] = (node_type)0x0;
      alloc = (allocator_type *)(ulong)(byte)left[8];
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
      ::remove_value(*(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                       **)left,(uint)(byte)left[8],paVar3);
      if (right[0xb] != (node_type)0x0) {
        if (this->rightmost_ == right) {
          this->rightmost_ = left;
        }
        delete_leaf_node((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                          *)right,(node_type *)alloc);
        return;
      }
      btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
      ::destroy(right,alloc);
      operator_delete(right,0x130);
      return;
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *, unsigned char, phmap::priv::(anonymous namespace)::StringLike, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::StringLike, phmap::Less<phmap::priv::(anonymous namespace)::StringLike>, std::allocator<phmap::priv::(anonymous namespace)::StringLike>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree<P>::merge_nodes(node_type *left, node_type *right) {
        left->merge(right, mutable_allocator());
        if (right->leaf()) {
            if (rightmost_ == right) rightmost_ = left;
            delete_leaf_node(right);
        } else {
            delete_internal_node(right);
        }
    }